

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O0

int nghttp2_submit_priority
              (nghttp2_session *session,uint8_t flags,int32_t stream_id,
              nghttp2_priority_spec *pri_spec)

{
  nghttp2_outbound_item *item_00;
  nghttp2_mem *mem;
  nghttp2_priority_spec copy_pri_spec;
  nghttp2_frame *frame;
  nghttp2_outbound_item *item;
  int rv;
  nghttp2_priority_spec *pri_spec_local;
  int32_t stream_id_local;
  uint8_t flags_local;
  nghttp2_session *session_local;
  
  if ((session->remote_settings).no_rfc7540_priorities == 1) {
    session_local._4_4_ = 0;
  }
  else if ((stream_id == 0) || (pri_spec == (nghttp2_priority_spec *)0x0)) {
    session_local._4_4_ = -0x1f5;
  }
  else if (stream_id == pri_spec->stream_id) {
    session_local._4_4_ = -0x1f5;
  }
  else {
    mem._4_4_ = pri_spec->stream_id;
    unique0x00012004 = pri_spec->weight;
    copy_pri_spec.stream_id = *(int32_t *)&pri_spec->exclusive;
    nghttp2_priority_spec_normalize_weight((nghttp2_priority_spec *)((long)&mem + 4));
    item_00 = (nghttp2_outbound_item *)nghttp2_mem_malloc(&session->mem,0x98);
    if (item_00 == (nghttp2_outbound_item *)0x0) {
      session_local._4_4_ = -0x385;
    }
    else {
      nghttp2_outbound_item_init(item_00);
      copy_pri_spec._4_8_ = item_00;
      nghttp2_frame_priority_init
                ((nghttp2_priority *)item_00,stream_id,(nghttp2_priority_spec *)((long)&mem + 4));
      session_local._4_4_ = nghttp2_session_add_item(session,item_00);
      if (session_local._4_4_ == 0) {
        session_local._4_4_ = 0;
      }
      else {
        nghttp2_frame_priority_free((nghttp2_priority *)copy_pri_spec._4_8_);
        nghttp2_mem_free(&session->mem,item_00);
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_submit_priority(nghttp2_session *session, uint8_t flags,
                            int32_t stream_id,
                            const nghttp2_priority_spec *pri_spec) {
  int rv;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_priority_spec copy_pri_spec;
  nghttp2_mem *mem;
  (void)flags;

  mem = &session->mem;

  if (session->remote_settings.no_rfc7540_priorities == 1) {
    return 0;
  }

  if (stream_id == 0 || pri_spec == NULL) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (stream_id == pri_spec->stream_id) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  copy_pri_spec = *pri_spec;

  nghttp2_priority_spec_normalize_weight(&copy_pri_spec);

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));

  if (item == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_outbound_item_init(item);

  frame = &item->frame;

  nghttp2_frame_priority_init(&frame->priority, stream_id, &copy_pri_spec);

  rv = nghttp2_session_add_item(session, item);

  if (rv != 0) {
    nghttp2_frame_priority_free(&frame->priority);
    nghttp2_mem_free(mem, item);

    return rv;
  }

  return 0;
}